

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

String __thiscall
testing::internal::XmlUnitTestResultPrinter::EscapeXml
          (XmlUnitTestResultPrinter *this,char *str,bool is_attribute)

{
  byte bVar1;
  XmlUnitTestResultPrinter *pXVar2;
  uint uVar3;
  size_t extraout_RDX;
  char *pcVar5;
  String SVar6;
  Message m;
  Message local_50;
  XmlUnitTestResultPrinter *local_48;
  String local_40;
  size_t sVar4;
  
  local_48 = this;
  Message::Message(&local_50);
  if (str == (char *)0x0) {
LAB_00158ab0:
    pXVar2 = local_48;
    SVar6 = StrStreamToString((internal *)local_48,local_50.ss_);
    sVar4 = SVar6.length_;
    if (local_50.ss_ != (StrStream *)0x0) {
      (**(code **)(*(long *)local_50.ss_ + 8))();
      sVar4 = extraout_RDX;
    }
    SVar6.length_ = sVar4;
    SVar6.c_str_ = (char *)pXVar2;
    return SVar6;
  }
  do {
    bVar1 = *str;
    if (bVar1 == 0x22) {
      pcVar5 = "&quot;";
      if (is_attribute) {
LAB_00158a63:
        Message::operator<<(&local_50,(char (*) [7])pcVar5);
      }
      else {
        local_40.c_str_._0_1_ = 0x22;
        Message::operator<<(&local_50,(char *)&local_40);
      }
    }
    else if (bVar1 == 0x26) {
      Message::operator<<(&local_50,(char (*) [6])"&amp;");
    }
    else if (bVar1 == 0x27) {
      pcVar5 = "&apos;";
      if (is_attribute) goto LAB_00158a63;
      local_40.c_str_._0_1_ = 0x27;
      Message::operator<<(&local_50,(char *)&local_40);
    }
    else {
      if (bVar1 == 0x3c) {
        pcVar5 = "&lt;";
      }
      else {
        pcVar5 = "&gt;";
        if (bVar1 != 0x3e) {
          uVar3 = (uint)bVar1;
          if (bVar1 != 0) {
            if (('\x1f' < (char)bVar1) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0))))
            {
              if ((is_attribute) && ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)))) {
                String::Format((char *)&local_40,"&#x%02X;");
                Message::operator<<(&local_50,&local_40);
                String::~String(&local_40);
              }
              else {
                Message::operator<<(&local_50,str);
              }
            }
            goto LAB_00158aa8;
          }
          goto LAB_00158ab0;
        }
      }
      Message::operator<<(&local_50,(char (*) [5])pcVar5);
    }
LAB_00158aa8:
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

String XmlUnitTestResultPrinter::EscapeXml(const char* str, bool is_attribute) {
  Message m;

  if (str != NULL) {
    for (const char* src = str; *src; ++src) {
      switch (*src) {
        case '<':
          m << "&lt;";
          break;
        case '>':
          m << "&gt;";
          break;
        case '&':
          m << "&amp;";
          break;
        case '\'':
          if (is_attribute)
            m << "&apos;";
          else
            m << '\'';
          break;
        case '"':
          if (is_attribute)
            m << "&quot;";
          else
            m << '"';
          break;
        default:
          if (IsValidXmlCharacter(*src)) {
            if (is_attribute && IsNormalizableWhitespace(*src))
              m << String::Format("&#x%02X;", unsigned(*src));
            else
              m << *src;
          }
          break;
      }
    }
  }

  return m.GetString();
}